

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidload.c
# Opt level: O3

void cid_parse_font_matrix(CID_Face face,CID_Parser *parser)

{
  uint uVar1;
  CID_FaceDict pCVar2;
  FT_Bool FVar3;
  FT_Int FVar4;
  FT_Long FVar5;
  long b_;
  FT_Fixed temp [6];
  FT_Long local_68;
  FT_Long local_60;
  FT_Long local_58;
  long local_50;
  FT_Long local_48;
  FT_Long local_40;
  
  uVar1 = parser->num_dict;
  if (uVar1 < (face->cid).num_dicts) {
    pCVar2 = (face->cid).font_dicts;
    FVar4 = (*(parser->root).funcs.to_fixed_array)(&parser->root,6,&local_68,3);
    if (5 < FVar4) {
      b_ = -local_50;
      if (0 < local_50) {
        b_ = local_50;
      }
      if (local_50 != 0) {
        if (b_ != 0x10000) {
          FVar5 = FT_DivFix(1000,b_);
          (face->root).units_per_EM = (FT_UShort)FVar5;
          local_68 = FT_DivFix(local_68,b_);
          local_60 = FT_DivFix(local_60,b_);
          local_58 = FT_DivFix(local_58,b_);
          local_48 = FT_DivFix(local_48,b_);
          local_40 = FT_DivFix(local_40,b_);
          local_50 = (ulong)(-1 < local_50) * 0x20000 + -0x10000;
        }
        pCVar2[uVar1].font_matrix.xx = local_68;
        pCVar2[uVar1].font_matrix.yx = local_60;
        pCVar2[uVar1].font_matrix.xy = local_58;
        pCVar2[uVar1].font_matrix.yy = local_50;
        FVar3 = FT_Matrix_Check(&pCVar2[uVar1].font_matrix);
        if (FVar3 == '\0') {
          (parser->root).error = 3;
        }
        else {
          pCVar2[uVar1].font_offset.x = local_48 >> 0x10;
          pCVar2[uVar1].font_offset.y = local_40 >> 0x10;
        }
      }
    }
  }
  return;
}

Assistant:

FT_CALLBACK_DEF( void )
  cid_parse_font_matrix( CID_Face     face,
                         CID_Parser*  parser )
  {
    CID_FaceDict  dict;
    FT_Face       root = (FT_Face)&face->root;
    FT_Fixed      temp[6];
    FT_Fixed      temp_scale;


    if ( parser->num_dict < face->cid.num_dicts )
    {
      FT_Matrix*  matrix;
      FT_Vector*  offset;
      FT_Int      result;


      dict   = face->cid.font_dicts + parser->num_dict;
      matrix = &dict->font_matrix;
      offset = &dict->font_offset;

      /* input is scaled by 1000 to accommodate default FontMatrix */
      result = cid_parser_to_fixed_array( parser, 6, temp, 3 );

      if ( result < 6 )
      {
        FT_ERROR(( "cid_parse_font_matrix: not enough matrix elements\n" ));
        goto Exit;
      }

      FT_TRACE4(( " [%f %f %f %f %f %f]\n",
                  (double)temp[0] / 65536 / 1000,
                  (double)temp[1] / 65536 / 1000,
                  (double)temp[2] / 65536 / 1000,
                  (double)temp[3] / 65536 / 1000,
                  (double)temp[4] / 65536 / 1000,
                  (double)temp[5] / 65536 / 1000 ));

      temp_scale = FT_ABS( temp[3] );

      if ( temp_scale == 0 )
      {
        FT_ERROR(( "cid_parse_font_matrix: invalid font matrix\n" ));
        goto Exit;
      }

      /* atypical case */
      if ( temp_scale != 0x10000L )
      {
        /* set units per EM based on FontMatrix values */
        root->units_per_EM = (FT_UShort)FT_DivFix( 1000, temp_scale );

        temp[0] = FT_DivFix( temp[0], temp_scale );
        temp[1] = FT_DivFix( temp[1], temp_scale );
        temp[2] = FT_DivFix( temp[2], temp_scale );
        temp[4] = FT_DivFix( temp[4], temp_scale );
        temp[5] = FT_DivFix( temp[5], temp_scale );
        temp[3] = temp[3] < 0 ? -0x10000L : 0x10000L;
      }

      matrix->xx = temp[0];
      matrix->yx = temp[1];
      matrix->xy = temp[2];
      matrix->yy = temp[3];

      if ( !FT_Matrix_Check( matrix ) )
      {
        FT_ERROR(( "t1_parse_font_matrix: invalid font matrix\n" ));
        parser->root.error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }

      /* note that the font offsets are expressed in integer font units */
      offset->x  = temp[4] >> 16;
      offset->y  = temp[5] >> 16;
    }

  Exit:
    return;
  }